

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOT<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  *(undefined ***)this_00 = &PTR__TPZSavable_019da870;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19da708;
  *(undefined8 *)this_00 = 0x19da7d0;
  *(undefined4 *)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  *(undefined1 *)((long)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019da020,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19da0f8;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19da1d8;
  TPZStructMatrixOT<double>::TPZStructMatrixOT
            ((TPZStructMatrixOT<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019da048,
             (TPZStructMatrixOT<double> *)
             &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  *(undefined8 *)this_00 = 0x19d9dd8;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19d9fa0;
  *(undefined8 *)&this_00->field_0xa0 = 0x19d9e98;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}